

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O1

int __thiscall Ptex::v2_2::PtexMainWriter::close(PtexMainWriter *this,int __fd)

{
  char *pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  int iVar4;
  char *in_RCX;
  undefined4 in_register_00000034;
  string local_48;
  
  iVar3 = PtexWriterBase::close(&this->super_PtexWriterBase,__fd);
  if (this->_reader != (PtexReader *)0x0) {
    (*(this->_reader->super_PtexTexture)._vptr_PtexTexture[2])();
    this->_reader = (PtexReader *)0x0;
  }
  if ((FILE *)this->_tmpfp != (FILE *)0x0) {
    fclose((FILE *)this->_tmpfp);
    unlink((this->_tmppath)._M_dataplus._M_p);
    this->_tmpfp = (FILE *)0x0;
  }
  if (((char)iVar3 != '\0') && (this->_hasNewData == true)) {
    unlink((this->super_PtexWriterBase)._path._M_dataplus._M_p);
    iVar4 = rename((this->_newpath)._M_dataplus._M_p,
                   (this->super_PtexWriterBase)._path._M_dataplus._M_p);
    if (iVar4 == -1) {
      (anonymous_namespace)::fileError_abi_cxx11_
                (&local_48,(_anonymous_namespace_ *)"Can\'t write to ptex file: ",
                 (this->super_PtexWriterBase)._path._M_dataplus._M_p,in_RCX);
      _Var2._M_p = local_48._M_dataplus._M_p;
      pcVar1 = *(char **)(CONCAT44(in_register_00000034,__fd) + 8);
      strlen(local_48._M_dataplus._M_p);
      std::__cxx11::string::_M_replace
                (CONCAT44(in_register_00000034,__fd),0,pcVar1,(ulong)_Var2._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      unlink((this->_newpath)._M_dataplus._M_p);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

bool PtexMainWriter::close(Ptex::String& error)
{
    // closing base writer will write all pending data via finish() method
    // and will close _fp (which in this case is on the temp disk)
    bool result = PtexWriterBase::close(error);
    if (_reader) {
        _reader->release();
        _reader = 0;
    }
    if (_tmpfp) {
        fclose(_tmpfp);
        unlink(_tmppath.c_str());
        _tmpfp = 0;
    }
    if (result && _hasNewData) {
        // rename temppath into final location
        unlink(_path.c_str());
        if (rename(_newpath.c_str(), _path.c_str()) == -1) {
            error = fileError("Can't write to ptex file: ", _path.c_str()).c_str();
            unlink(_newpath.c_str());
            result = false;
        }
    }
    return result;
}